

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::LWOImporter::CanRead(LWOImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  string extension;
  uint32_t tokens [3];
  string local_58;
  undefined8 local_34;
  undefined4 local_2c;
  
  BaseImporter::GetExtension(&local_58,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_58);
  bVar1 = true;
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_58);
    if (iVar2 != 0) {
      if (local_58._M_string_length == 0 || checkSig) {
        local_34 = 0x4c574f324c574f42;
        local_2c = 0x4c584f42;
        bVar1 = BaseImporter::CheckMagicToken(pIOHandler,pFile,&local_34,3,8,4);
      }
      else {
        bVar1 = false;
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool LWOImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string extension = GetExtension(pFile);
    if (extension == "lwo" || extension == "lxo") {
        return true;
    }

    // if check for extension is not enough, check for the magic tokens
    if (!extension.length() || checkSig) {
        uint32_t tokens[3];
        tokens[0] = AI_LWO_FOURCC_LWOB;
        tokens[1] = AI_LWO_FOURCC_LWO2;
        tokens[2] = AI_LWO_FOURCC_LXOB;
        return CheckMagicToken(pIOHandler,pFile,tokens,3,8);
    }
    return false;
}